

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O2

bool Jinx::Impl::StringToValueType(String *value,ValueType *outValue)

{
  bool bVar1;
  ValueType VVar2;
  
  bVar1 = std::operator==(value,"null");
  VVar2 = Null;
  if (!bVar1) {
    bVar1 = std::operator==(value,"number");
    if (bVar1) {
      VVar2 = Number;
    }
    else {
      bVar1 = std::operator==(value,"integer");
      if (bVar1) {
        VVar2 = Integer;
      }
      else {
        bVar1 = std::operator==(value,"boolean");
        if (bVar1) {
          VVar2 = Boolean;
        }
        else {
          bVar1 = std::operator==(value,"string");
          if (bVar1) {
            VVar2 = String;
          }
          else {
            bVar1 = std::operator==(value,"collection");
            if (bVar1) {
              VVar2 = Collection;
            }
            else {
              bVar1 = std::operator==(value,"collectionitr");
              if (bVar1) {
                VVar2 = CollectionItr;
              }
              else {
                bVar1 = std::operator==(value,"function");
                if (bVar1) {
                  VVar2 = Function;
                }
                else {
                  bVar1 = std::operator==(value,"buffer");
                  if (bVar1) {
                    VVar2 = Buffer;
                  }
                  else {
                    bVar1 = std::operator==(value,"guid");
                    if (bVar1) {
                      VVar2 = Guid;
                    }
                    else {
                      bVar1 = std::operator==(value,"valtype");
                      if (!bVar1) {
                        return false;
                      }
                      VVar2 = ValType;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  *outValue = VVar2;
  return true;
}

Assistant:

inline bool StringToValueType(const String & value, ValueType * outValue)
	{
		if (value == "null")
		{
			*outValue = ValueType::Null;
			return true;
		}
		else if (value == "number")
		{
			*outValue = ValueType::Number;
			return true;
		}
		else if (value == "integer")
		{
			*outValue = ValueType::Integer;
			return true;
		}
		else if (value == "boolean")
		{
			*outValue = ValueType::Boolean;
			return true;
		}
		else if (value == "string")
		{
			*outValue = ValueType::String;
			return true;
		}
		else if (value == "collection")
		{
			*outValue = ValueType::Collection;
			return true;
		}
		else if (value == "collectionitr")
		{
			*outValue = ValueType::CollectionItr;
			return true;
		}
		else if (value == "function")
		{
			*outValue = ValueType::Function;
			return true;
		}
		else if (value == "buffer")
		{
			*outValue = ValueType::Buffer;
			return true;
		}
		else if (value == "guid")
		{
			*outValue = ValueType::Guid;
			return true;
		}
		else if (value == "valtype")
		{
			*outValue = ValueType::ValType;
			return true;
		}
		return false;
	}